

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O3

void __thiscall duckdb_re2::RE2::Init(RE2 *this,StringPiece *pattern,Options *options)

{
  const_pointer pcVar1;
  size_type sVar2;
  Encoding EVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  ParseFlags global_flags;
  uint uVar12;
  long *plVar13;
  undefined8 *puVar14;
  string *psVar15;
  Regexp *pRVar16;
  Prog *pPVar17;
  ostream *poVar18;
  RegexpStatusCode RVar19;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  bool foldcase;
  RegexpStatus status;
  Regexp *suffix;
  bool local_219;
  RegexpStatus local_218;
  char *local_1f8;
  long local_1f0;
  char local_1e8 [16];
  string local_1d8;
  Regexp *local_1b8;
  size_type local_1b0;
  undefined1 local_1a8 [8];
  size_type local_1a0;
  ios_base local_130 [264];
  
  local_1a8 = (undefined1  [8])&local_218;
  plVar13 = (long *)__tls_get_addr(&PTR_02493620);
  *plVar13 = (long)local_1a8;
  puVar14 = (undefined8 *)__tls_get_addr(&PTR_0248e598);
  *puVar14 = std::once_flag::_Prepare_execution::
             _Prepare_execution<(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/mutex:775:25)>
             ::anon_class_1_0_00000001::__invoke;
  iVar11 = pthread_once(&Init::empty_once._M_once,__once_proxy);
  if (iVar11 == 0) {
    *plVar13 = 0;
    *puVar14 = 0;
    psVar15 = (string *)operator_new(0x20);
    pcVar1 = pattern->data_;
    if (pcVar1 == (const_pointer)0x0) {
      (psVar15->_M_dataplus)._M_p = (pointer)&psVar15->field_2;
      psVar15->_M_string_length = 0;
      (psVar15->field_2)._M_local_buf[0] = '\0';
    }
    else {
      sVar2 = pattern->size_;
      (psVar15->_M_dataplus)._M_p = (pointer)&psVar15->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)psVar15,pcVar1,pcVar1 + sVar2);
    }
    this->pattern_ = psVar15;
    EVar3 = options->encoding_;
    bVar10 = options->posix_syntax_;
    bVar4 = options->longest_match_;
    bVar5 = options->log_errors_;
    bVar6 = options->literal_;
    (this->options_).max_mem_ = options->max_mem_;
    (this->options_).encoding_ = EVar3;
    (this->options_).posix_syntax_ = bVar10;
    (this->options_).longest_match_ = bVar4;
    (this->options_).log_errors_ = bVar5;
    (this->options_).literal_ = bVar6;
    bVar10 = options->never_nl_;
    bVar4 = options->dot_nl_;
    bVar5 = options->never_capture_;
    bVar6 = options->case_sensitive_;
    bVar7 = options->perl_classes_;
    bVar8 = options->word_boundary_;
    bVar9 = options->one_line_;
    (this->options_).literal_ = options->literal_;
    (this->options_).never_nl_ = bVar10;
    (this->options_).dot_nl_ = bVar4;
    (this->options_).never_capture_ = bVar5;
    (this->options_).case_sensitive_ = bVar6;
    (this->options_).perl_classes_ = bVar7;
    (this->options_).word_boundary_ = bVar8;
    (this->options_).one_line_ = bVar9;
    this->entire_regexp_ = (Regexp *)0x0;
    this->suffix_regexp_ = (Regexp *)0x0;
    this->error_ = (string *)empty_storage;
    this->error_arg_ = (string *)empty_storage;
    this->num_captures_ = -1;
    *(uint *)&this->field_0x44 = (uint)(this->options_).longest_match_ << 0x1d;
    (this->prefix_)._M_string_length = 0;
    *(this->prefix_)._M_dataplus._M_p = '\0';
    this->named_groups_ =
         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *)0x0;
    this->group_names_ =
         (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x0;
    this->prog_ = (Prog *)0x0;
    this->rprog_ = (Prog *)0x0;
    local_218.code_ = kRegexpSuccess;
    local_218.error_arg_.data_ = (const_pointer)0x0;
    local_218.error_arg_.size_ = 0;
    local_218.tmp_ = (string *)0x0;
    local_1a8 = (undefined1  [8])(this->pattern_->_M_dataplus)._M_p;
    local_1a0 = this->pattern_->_M_string_length;
    global_flags = Options::ParseFlags(&this->options_);
    pRVar16 = Regexp::Parse((StringPiece *)local_1a8,global_flags,&local_218);
    this->entire_regexp_ = pRVar16;
    if (pRVar16 == (Regexp *)0x0) {
      if ((this->options_).log_errors_ == true) {
        local_1a8 = (undefined1  [8])((ulong)local_1a8 & 0xffffffffffffff00);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a0,"Error parsing \'",0xf);
        local_1b8 = (Regexp *)(this->pattern_->_M_dataplus)._M_p;
        local_1b0 = this->pattern_->_M_string_length;
        trunc_abi_cxx11_((duckdb_re2 *)&local_1f8,
                         (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1a0,local_1f8,local_1f0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\': ",3);
        RegexpStatus::Text_abi_cxx11_(&local_1d8,&local_218);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p);
        }
        if (local_1f8 != local_1e8) {
          operator_delete(local_1f8);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
        std::ios_base::~ios_base(local_130);
      }
      psVar15 = (string *)operator_new(0x20);
      RegexpStatus::Text_abi_cxx11_(psVar15,&local_218);
      this->error_ = psVar15;
      RVar19 = kRegexpInternalError;
      if (local_218.code_ < (kRegexpBadNamedCapture|kRegexpInternalError)) {
        RVar19 = local_218.code_;
      }
      *(RegexpStatusCode *)&this->field_0x44 =
           *(RegexpStatusCode *)&this->field_0x44 & 0xe0000000 | RVar19;
      psVar15 = (string *)operator_new(0x20);
      if (local_218.error_arg_.data_ == (const_pointer)0x0) {
        (psVar15->_M_dataplus)._M_p = (pointer)&psVar15->field_2;
        psVar15->_M_string_length = 0;
        (psVar15->field_2)._M_local_buf[0] = '\0';
      }
      else {
        (psVar15->_M_dataplus)._M_p = (pointer)&psVar15->field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)psVar15,local_218.error_arg_.data_,
                   local_218.error_arg_.data_ + local_218.error_arg_.size_);
      }
      this->error_arg_ = psVar15;
    }
    else {
      bVar10 = Regexp::RequiredPrefix(pRVar16,&this->prefix_,&local_219,&local_1b8);
      if (bVar10) {
        *(uint *)&this->field_0x44 =
             *(uint *)&this->field_0x44 & 0x7fffffff | (uint)local_219 << 0x1f;
        pRVar16 = local_1b8;
      }
      else {
        pRVar16 = Regexp::Incref(this->entire_regexp_);
      }
      this->suffix_regexp_ = pRVar16;
      pPVar17 = Regexp::CompileToProg(pRVar16,((this->options_).max_mem_ * 2) / 3);
      this->prog_ = pPVar17;
      if (pPVar17 == (Prog *)0x0) {
        if ((this->options_).log_errors_ == true) {
          local_1a8 = (undefined1  [8])((ulong)local_1a8 & 0xffffffffffffff00);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a0,"Error compiling \'",0x11);
          local_1d8._M_dataplus._M_p = (this->pattern_->_M_dataplus)._M_p;
          local_1d8._M_string_length = this->pattern_->_M_string_length;
          trunc_abi_cxx11_((duckdb_re2 *)&local_1f8,
                           (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
          poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_1a0,local_1f8,local_1f0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\'",1);
          if (local_1f8 != local_1e8) {
            operator_delete(local_1f8);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
          std::ios_base::~ios_base(local_130);
        }
        psVar15 = (string *)operator_new(0x20);
        (psVar15->_M_dataplus)._M_p = (pointer)&psVar15->field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)psVar15,"pattern too large - compile failed","");
        this->error_ = psVar15;
        uVar12 = *(uint *)&this->field_0x44 & 0xe0000000 | 0xf;
      }
      else {
        iVar11 = Regexp::NumCaptures(this->suffix_regexp_);
        this->num_captures_ = iVar11;
        bVar10 = Prog::IsOnePass(this->prog_);
        uVar12 = *(uint *)&this->field_0x44 & 0xbfffffff | (uint)bVar10 << 0x1e;
      }
      *(uint *)&this->field_0x44 = uVar12;
    }
    RegexpStatus::~RegexpStatus(&local_218);
    return;
  }
  std::__throw_system_error(iVar11);
}

Assistant:

void RE2::Init(const StringPiece& pattern, const Options& options) {
  static std::once_flag empty_once;
  std::call_once(empty_once, []() {
    (void) new (empty_storage) EmptyStorage;
  });

  pattern_ = new std::string(pattern);
  options_.Copy(options);
  entire_regexp_ = NULL;
  suffix_regexp_ = NULL;
  error_ = empty_string();
  error_arg_ = empty_string();

  num_captures_ = -1;
  error_code_ = NoError;
  longest_match_ = options_.longest_match();
  is_one_pass_ = false;
  prefix_foldcase_ = false;
  prefix_.clear();
  prog_ = NULL;

  rprog_ = NULL;
  named_groups_ = NULL;
  group_names_ = NULL;

  RegexpStatus status;
  entire_regexp_ = Regexp::Parse(
    *pattern_,
    static_cast<Regexp::ParseFlags>(options_.ParseFlags()),
    &status);
  if (entire_regexp_ == NULL) {
    if (options_.log_errors()) {
      LOG(ERROR) << "Error parsing '" << trunc(*pattern_) << "': "
                 << status.Text();
    }
    error_ = new std::string(status.Text());
    error_code_ = RegexpErrorToRE2(status.code());
    error_arg_ = new std::string(status.error_arg());
    return;
  }

  bool foldcase;
  duckdb_re2::Regexp* suffix;
  if (entire_regexp_->RequiredPrefix(&prefix_, &foldcase, &suffix)) {
    prefix_foldcase_ = foldcase;
    suffix_regexp_ = suffix;
  }
  else {
    suffix_regexp_ = entire_regexp_->Incref();
  }

  // Two thirds of the memory goes to the forward Prog,
  // one third to the reverse prog, because the forward
  // Prog has two DFAs but the reverse prog has one.
  prog_ = suffix_regexp_->CompileToProg(options_.max_mem()*2/3);
  if (prog_ == NULL) {
    if (options_.log_errors())
      LOG(ERROR) << "Error compiling '" << trunc(*pattern_) << "'";
    error_ = new std::string("pattern too large - compile failed");
    error_code_ = RE2::ErrorPatternTooLarge;
    return;
  }

  // We used to compute this lazily, but it's used during the
  // typical control flow for a match call, so we now compute
  // it eagerly, which avoids the overhead of std::once_flag.
  num_captures_ = suffix_regexp_->NumCaptures();

  // Could delay this until the first match call that
  // cares about submatch information, but the one-pass
  // machine's memory gets cut from the DFA memory budget,
  // and that is harder to do if the DFA has already
  // been built.
  is_one_pass_ = prog_->IsOnePass();
}